

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O2

vm_obj_id_t CVmBifTADS::format_datetime_list(time_t timer)

{
  vm_datatype_t *pvVar1;
  vm_val_t *pvVar2;
  vm_val_t *pvVar3;
  vm_obj_id_t vVar4;
  tm *ptVar5;
  ulong in_RDI;
  char *dst;
  char buf [80];
  char *local_88;
  ulong local_80;
  char local_78 [80];
  
  pvVar2 = sp_;
  local_80 = in_RDI;
  ptVar5 = localtime((time_t *)&local_80);
  local_88 = local_78 + 2;
  local_78[0] = '\t';
  local_78[1] = '\0';
  put_list_int(&local_88,(long)ptVar5->tm_year + 0x76c);
  put_list_int(&local_88,(long)ptVar5->tm_mon + 1);
  put_list_int(&local_88,(long)ptVar5->tm_mday);
  put_list_int(&local_88,(long)ptVar5->tm_wday + 1);
  put_list_int(&local_88,(long)ptVar5->tm_yday + 1);
  put_list_int(&local_88,(long)ptVar5->tm_hour);
  put_list_int(&local_88,(long)ptVar5->tm_min);
  put_list_int(&local_88,(long)ptVar5->tm_sec);
  if ((long)local_80 < 0x80000000) {
    put_list_int(&local_88,local_80 & 0xffffffff);
  }
  else {
    vVar4 = CVmObjBigNum::create_int64(0,(uint32_t)(local_80 >> 0x20),(uint32_t)local_80);
    pvVar3 = sp_;
    pvVar1 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar1 = VM_OBJ;
    (pvVar3->val).obj = vVar4;
    put_list_obj(&local_88,vVar4);
  }
  vVar4 = CVmObjList::create(0,local_78);
  sp_ = pvVar2;
  return vVar4;
}

Assistant:

vm_obj_id_t CVmBifTADS::format_datetime_list(VMG_ os_time_t timer)
{
    /* note the starting stack pointer, so we can discard gc protection */
    vm_val_t *gsp = G_stk->get_sp();
    
    /* convert the time_t to the local time */
    struct tm *tblock = os_localtime(&timer);

    /* start the list buffer - set the length (9 elements) */
    char buf[80];
    vmb_put_len(buf, 9);
    char *dst = buf + VMB_LEN;
    
    /* add the time elements to the list */
    put_list_int(&dst, tblock->tm_year + 1900);
    put_list_int(&dst, tblock->tm_mon + 1);
    put_list_int(&dst, tblock->tm_mday);
    put_list_int(&dst, tblock->tm_wday + 1);
    put_list_int(&dst, tblock->tm_yday + 1);
    put_list_int(&dst, tblock->tm_hour);
    put_list_int(&dst, tblock->tm_min);
    put_list_int(&dst, tblock->tm_sec);

    /* 
     *   if the timer is over 0x7fffffff, we can't represent it as an
     *   int32_t, so store it as a BigNumber value
     */
    if (timer <= 0x7fffffffU)
    {
        /* it'll fit in an ordinary 32-bit signed int */
        put_list_int(&dst, (uint32_t)timer);
    }
    else
    {
        /* it won't fit an int32, so convert to BigNumber */
        vm_obj_id_t bn;
        if (sizeof(timer) <= 4)
        {
            /* os_time_t must be a uint32 */
            bn = CVmObjBigNum::createu(vmg_ FALSE, (ulong)timer, 10);
        }
        else
        {
            /* os_time_t must be 64 bits (or larger) */
            bn = CVmObjBigNum::create_int64(
                vmg_ FALSE, (uint32_t)(timer >> 32),
                (uint32_t)(timer & 0xFFFFFFFF));
        }

        /* save it on the stack for gc protection */
        G_stk->push()->set_obj(bn);
        
        /* add it to the list */
        put_list_obj(&dst, bn);
    }

    /* create a list from the formatted buffer, and return its object ID */
    vm_obj_id_t lst = CVmObjList::create(vmg_ FALSE, buf);

    /* discard gc protection */
    G_stk->set_sp(gsp);

    /* return the list */
    return lst;
}